

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O1

void gdImageColorTransparent(gdImagePtr im,int color)

{
  if (-1 < color) {
    if (im->trueColor == 0) {
      if (0xff < color) {
        return;
      }
      if ((long)im->transparent != -1) {
        im->alpha[im->transparent] = 0;
      }
      im->alpha[(uint)color] = 0x7f;
    }
    im->transparent = color;
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageColorTransparent (gdImagePtr im, int color)
{
	if (color < 0) {
		return;
	}

	if (!im->trueColor) {
		if((color < -1) || (color >= gdMaxColors)) {
			return;
		}
		if (im->transparent != -1) {
			im->alpha[im->transparent] = gdAlphaOpaque;
		}
		if (color != -1) {
			im->alpha[color] = gdAlphaTransparent;
		}
	}
	im->transparent = color;
}